

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall QWidget::setAutoFillBackground(QWidget *this,bool enabled)

{
  QWidgetPrivate *this_00;
  QWExtra *pQVar1;
  
  this_00 = *(QWidgetPrivate **)&this->field_0x8;
  pQVar1 = (this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
           super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
           super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
  if (pQVar1 == (QWExtra *)0x0) {
    QWidgetPrivate::createExtra(this_00);
    pQVar1 = (this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>.
             _M_t.super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
             super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
  }
  if (((*(ushort *)&pQVar1->field_0x7c & 0x10) == 0) != enabled) {
    return;
  }
  *(ushort *)&pQVar1->field_0x7c = *(ushort *)&pQVar1->field_0x7c & 0xffef | (ushort)enabled << 4;
  QWidgetPrivate::updateIsOpaque(this_00);
  update(this);
  QWidgetPrivate::updateIsOpaque(this_00);
  return;
}

Assistant:

void QWidget::setAutoFillBackground(bool enabled)
{
    Q_D(QWidget);
    if (!d->extra)
        d->createExtra();
    if (d->extra->autoFillBackground == enabled)
        return;

    d->extra->autoFillBackground = enabled;
    d->updateIsOpaque();
    update();
    d->updateIsOpaque();
}